

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O0

void __thiscall Minisat::Solver::binDRUP_flush(Solver *this,FILE *drup_file)

{
  FILE *in_RSI;
  long in_RDI;
  
  fwrite_unlocked(drup_buf,1,(long)*(int *)(in_RDI + 0x678),in_RSI);
  *(uchar **)(in_RDI + 0x680) = drup_buf;
  *(undefined4 *)(in_RDI + 0x678) = 0;
  return;
}

Assistant:

inline void binDRUP_flush(FILE *drup_file)
    {
#if defined(__linux__)
        fwrite_unlocked(drup_buf, sizeof(unsigned char), buf_len, drup_file);
#else
        fwrite(drup_buf, sizeof(unsigned char), buf_len, drup_file);
#endif
        buf_ptr = drup_buf;
        buf_len = 0;
    }